

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp.c
# Opt level: O0

uint32 fe_warp_id(melfb_t *mel)

{
  uint32 uVar1;
  uint32 uVar2;
  melfb_t *mel_local;
  
  if (mel->warp_id < 3) {
    uVar1 = mel->warp_id;
    uVar2 = (*fe_warp_conf[mel->warp_id].id)();
    if (uVar1 != uVar2) {
      __assert_fail("mel->warp_id == fe_warp_conf[mel->warp_id].id()",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp.c"
                    ,0xac,"uint32 fe_warp_id(melfb_t *)");
    }
    mel_local._4_4_ = mel->warp_id;
  }
  else {
    if (mel->warp_id != 0xffffffff) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp.c"
              ,0xb2,"fe_warp module misconfigured with invalid fe_warp_id %u\n",(ulong)mel->warp_id)
      ;
      exit(1);
    }
    mel_local._4_4_ = 0xffffffff;
  }
  return mel_local._4_4_;
}

Assistant:

uint32
fe_warp_id(melfb_t *mel)
{
    if (mel->warp_id <= FE_WARP_ID_MAX) {
        assert(mel->warp_id == fe_warp_conf[mel->warp_id].id());
        return mel->warp_id;
    }
    else if (mel->warp_id != FE_WARP_ID_NONE) {
        E_FATAL
            ("fe_warp module misconfigured with invalid fe_warp_id %u\n",
             mel->warp_id);
    }

    return FE_WARP_ID_NONE;
}